

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<tcu::Vector<float,_4>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_4>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  long lVar1;
  double *pdVar2;
  IRet *pIVar3;
  byte bVar4;
  double adStack_78 [12];
  
  bVar4 = 0;
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x70);
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x70);
  if ((iargs->a->m_lo <= 1.0) && (1.0 <= iargs->a->m_hi)) {
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doUnion
              (__return_storage_ptr__,iargs->b);
    pdVar2 = adStack_78;
    pIVar3 = __return_storage_ptr__;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)pIVar3->m_data = *pdVar2;
      pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
      pIVar3 = (IRet *)((long)pIVar3 + ((ulong)bVar4 * -2 + 1) * 8);
    }
  }
  if ((iargs->a->m_lo <= 0.0) && (0.0 <= iargs->a->m_hi)) {
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doUnion
              (__return_storage_ptr__,iargs->c);
    pdVar2 = adStack_78;
    pIVar3 = __return_storage_ptr__;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)pIVar3->m_data = *pdVar2;
      pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
      pIVar3 = (IRet *)((long)pIVar3 + ((ulong)bVar4 * -2 + 1) * 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}